

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lisp2c.c
# Opt level: O0

int LispIntToCInt(LispPTR lispint)

{
  int iVar1;
  LispPTR *pLVar2;
  char local_d8 [8];
  char msg [200];
  LispPTR lispint_local;
  
  if (lispint >> 0x10 == 0xe) {
    msg._196_4_ = lispint & 0xffff;
  }
  else if (lispint >> 0x10 == 0xf) {
    msg._196_4_ = lispint | 0xffff0000;
  }
  else {
    msg._192_4_ = lispint;
    if ((*(ushort *)((ulong)(MDStypetbl + (lispint >> 9)) ^ 2) & 0x7ff) == 2) {
      pLVar2 = NativeAligned4FromLAddr(lispint);
      msg._196_4_ = *pLVar2;
    }
    else {
      sprintf(local_d8,"Arg 0x%x isn\'t a lisp integer.",(ulong)lispint);
      error(local_d8);
      msg[0xc4] = '\0';
      msg[0xc5] = '\0';
      msg[0xc6] = '\0';
      msg[199] = '\0';
    }
  }
  iVar1._0_1_ = msg[0xc4];
  iVar1._1_1_ = msg[0xc5];
  iVar1._2_1_ = msg[0xc6];
  iVar1._3_1_ = msg[199];
  return iVar1;
}

Assistant:

int LispIntToCInt(LispPTR lispint) {
  switch ((0xFFFF0000 & lispint)) {
    case S_POSITIVE: return (lispint & 0xFFFF);
    case S_NEGATIVE: return (lispint | 0xFFFF0000);
    default:
      if (GetTypeNumber(lispint) == TYPE_FIXP) {
        return (*((int *)NativeAligned4FromLAddr(lispint)));
      } else {
        char msg[200];
        sprintf(msg, "Arg 0x%x isn't a lisp integer.", lispint);
        error(msg);
        /* NOTREACHED */
        return(0);
      }
  }
}